

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_30::DatagramPortImpl::send
          (DatagramPortImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  PromiseNode *pPVar1;
  int osErrorNumber;
  SocketAddress *pSVar2;
  FixVoid<unsigned_long> value;
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  Fault f;
  Own<kj::_::PromiseNode> local_60;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  
  pSVar2 = NetworkAddressImpl::chooseOneAddress
                     ((NetworkAddressImpl *)CONCAT44(in_register_00000084,__flags));
  do {
    value = sendto(*(int *)((_func_int **)CONCAT44(in_register_00000034,__fd) + 1),__buf,__n,0,
                   (sockaddr *)&(pSVar2->addr).generic,pSVar2->addrlen);
    if (-1 < (long)value) {
      Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,value);
      return (ssize_t)this;
    }
    osErrorNumber = kj::_::Debug::getOsErrorNumber(true);
  } while (osErrorNumber == -1);
  if (osErrorNumber == 0) {
    UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)&local_60);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_60,
               kj::_::
               TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:1316:48),_kj::_::PropagateException>
               ::anon_class_32_4_857ca970_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0067c400;
    this_00[1].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)CONCAT44(in_register_00000034,__fd);
    this_00[1].dependency.disposer = (Disposer *)__buf;
    this_00[1].dependency.ptr = (PromiseNode *)__n;
    this_00[1].continuationTracePtr = (NetworkAddressImpl *)CONCAT44(in_register_00000084,__flags);
    f.exception = (Exception *)
                  &kj::_::
                   HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::DatagramPortImpl::send(void_const*,unsigned_long,kj::NetworkAddress&)::$_1,kj::_::PropagateException>>
                   ::instance;
    kj::_::maybeChain<unsigned_long>(&local_50,(Promise<unsigned_long> *)&f);
    pPVar1 = local_50.ptr;
    local_40.disposer = local_50.disposer;
    local_50.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_50);
    (this->super_DatagramPort)._vptr_DatagramPort = (_func_int **)local_50.disposer;
    this->super_OwnedFileDescriptor = (OwnedFileDescriptor)pPVar1;
    local_40.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_40);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
    Own<kj::_::PromiseNode>::dispose(&local_60);
    return (ssize_t)this;
  }
  kj::_::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x521,osErrorNumber,
             "n = sendto(fd, buffer, size, 0, addr.getRaw(), addr.getRawSize())","");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Promise<size_t> DatagramPortImpl::send(
    const void* buffer, size_t size, NetworkAddress& destination) {
  auto& addr = downcast<NetworkAddressImpl>(destination).chooseOneAddress();

  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = sendto(fd, buffer, size, 0, addr.getRaw(), addr.getRawSize()));
  if (n < 0) {
    // Write buffer full.
    return observer.whenBecomesWritable().then([this, buffer, size, &destination]() {
      return send(buffer, size, destination);
    });
  } else {
    // If less than the whole message was sent, then it got truncated, and there's nothing we can
    // do about it.
    return n;
  }
}